

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyDeclareUserTag(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  TidyOptionId TVar1;
  UserTagType local_24;
  UserTagType tagType;
  ctmbstr name_local;
  TidyOptionImpl *opt_local;
  TidyDocImpl *doc_local;
  
  TVar1 = opt->id;
  if (TVar1 == TidyBlockTags) {
    local_24 = tagtype_block;
  }
  else if (TVar1 == TidyCustomTags) {
    switch((doc->config).value[0x55].v) {
    case 1:
      local_24 = tagtype_block;
      break;
    case 2:
      local_24 = tagtype_empty;
      break;
    case 3:
      local_24 = tagtype_inline;
      break;
    case 4:
      local_24 = tagtype_pre;
      break;
    default:
      prvTidyReportUnknownOption(doc,opt->name);
      return;
    }
  }
  else if (TVar1 == TidyEmptyTags) {
    local_24 = tagtype_empty;
  }
  else if (TVar1 == TidyInlineTags) {
    local_24 = tagtype_inline;
  }
  else {
    if (TVar1 != TidyPreTags) {
      prvTidyReportUnknownOption(doc,opt->name);
      return;
    }
    local_24 = tagtype_pre;
  }
  prvTidyDefineTag(doc,local_24,name);
  return;
}

Assistant:

void TY_(DeclareUserTag)( TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name )
{
    UserTagType tagType;

    switch ( opt->id )
    {
        case TidyInlineTags:  tagType = tagtype_inline;              break;
        case TidyBlockTags:   tagType = tagtype_block;               break;
        case TidyEmptyTags:   tagType = tagtype_empty;               break;
        case TidyPreTags:     tagType = tagtype_pre;                 break;
        case TidyCustomTags:
        {
            switch (cfg( doc, TidyUseCustomTags ))
            {
                case TidyCustomBlocklevel: tagType = tagtype_block;  break;
                case TidyCustomEmpty:      tagType = tagtype_empty;  break;
                case TidyCustomInline:     tagType = tagtype_inline; break;
                case TidyCustomPre:        tagType = tagtype_pre;    break;
                default: TY_(ReportUnknownOption)( doc, opt->name ); return;
            }
        } break;
        default:
        TY_(ReportUnknownOption)( doc, opt->name );
        return;
    }

    TY_(DefineTag)( doc, tagType, name );
}